

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_Font * ON_Font::Internal_BestMatchWeightStretchStyle
                    (Weight prefered_weight,Stretch prefered_stretch,Style prefered_style,
                    ON_Font **font_list,size_t font_count)

{
  ON_Font *pOVar1;
  ON_Font *pOVar2;
  ON_Font *pOVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  size_t i;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  
  if (font_count == 0 || font_list == (ON_Font **)0x0) {
    pOVar2 = (ON_Font *)0x0;
  }
  else {
    uVar7 = 0xffffffff;
    sVar8 = 0;
    pOVar3 = (ON_Font *)0x0;
    do {
      pOVar1 = font_list[sVar8];
      pOVar2 = pOVar3;
      uVar10 = uVar7;
      if (pOVar1 != (ON_Font *)0x0) {
        uVar10 = (uint)prefered_weight;
        if (prefered_weight == Unset) {
          uVar10 = (uint)pOVar1->m_font_weight;
        }
        uVar9 = (uint)prefered_stretch;
        if (prefered_stretch == Unset) {
          uVar9 = (uint)pOVar1->m_font_stretch;
        }
        uVar4 = (uint)prefered_style;
        if (prefered_style == Unset) {
          uVar4 = (uint)pOVar1->m_font_style;
        }
        uVar10 = uVar10 - pOVar1->m_font_weight;
        uVar5 = -uVar10;
        if (0 < (int)uVar10) {
          uVar5 = uVar10;
        }
        uVar9 = uVar9 - pOVar1->m_font_stretch;
        uVar10 = -uVar9;
        if (0 < (int)uVar9) {
          uVar10 = uVar9;
        }
        uVar4 = uVar4 - pOVar1->m_font_style;
        uVar9 = -uVar4;
        if (0 < (int)uVar4) {
          uVar9 = uVar4;
        }
        iVar6 = (uVar10 & 0xff) + (uVar5 & 0xff) * 0x14 + (uVar9 & 0xff) * 1000;
        if (iVar6 == 0) {
          return pOVar1;
        }
        uVar10 = iVar6 * 4;
        pOVar2 = pOVar1;
        if (uVar7 <= uVar10 && pOVar3 != (ON_Font *)0x0) {
          pOVar2 = pOVar3;
          uVar10 = uVar7;
        }
      }
      uVar7 = uVar10;
      sVar8 = sVar8 + 1;
      pOVar3 = pOVar2;
    } while (font_count != sVar8);
  }
  return pOVar2;
}

Assistant:

const ON_Font* ON_Font::Internal_BestMatchWeightStretchStyle(
  ON_Font::Weight prefered_weight,
  ON_Font::Stretch prefered_stretch,
  ON_Font::Style prefered_style,
  ON_Font const * const * font_list, 
  size_t font_count
)
{
  if (nullptr == font_list || font_count <= 0)
    return nullptr;

  const ON_Font* best_font = nullptr;
  unsigned int best_delta = 0xFFFFFFFF;
  for (size_t i = 0; i < font_count; i++)
  {
    const ON_Font* font = font_list[i];
    if (nullptr == font)
      continue;
    const unsigned int delta = ON_Font::WeightStretchStyleDeviation(
      prefered_weight, 
      prefered_stretch, 
      prefered_style,
      font
    );
    if (0 == delta)
      return font;
    if (nullptr == best_font || delta < best_delta)
    {
      best_font = font;
      best_delta = delta;
    }
  }

  return best_font;
}